

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pkey.cc
# Opt level: O0

EVP_PKEY * PEM_read_bio_PrivateKey(BIO *bp,EVP_PKEY **x,undefined1 *cb,void *u)

{
  int iVar1;
  PKCS8_PRIV_KEY_INFO *pPVar2;
  X509_SIG *p8_00;
  char local_478 [8];
  char psbuf [1024];
  int pass_len;
  X509_SIG *p8;
  PKCS8_PRIV_KEY_INFO *p8inf_1;
  PKCS8_PRIV_KEY_INFO *p8inf;
  EVP_PKEY *ret;
  long len;
  uchar *data;
  uchar *p;
  char *nm;
  void *u_local;
  pem_password_cb *cb_local;
  EVP_PKEY **x_local;
  BIO *bp_local;
  
  p = (uchar *)0x0;
  data = (uchar *)0x0;
  len = 0;
  p8inf = (PKCS8_PRIV_KEY_INFO *)0x0;
  nm = (char *)u;
  u_local = cb;
  cb_local = (pem_password_cb *)x;
  x_local = (EVP_PKEY **)bp;
  iVar1 = PEM_bytes_read_bio((uchar **)&len,(long *)&ret,(char **)&p,"ANY PRIVATE KEY",bp,cb,u);
  if (iVar1 == 0) {
    return (EVP_PKEY *)0x0;
  }
  data = (uchar *)len;
  iVar1 = strcmp((char *)p,"PRIVATE KEY");
  if (iVar1 == 0) {
    pPVar2 = d2i_PKCS8_PRIV_KEY_INFO((PKCS8_PRIV_KEY_INFO **)0x0,&data,(long)ret);
    if (pPVar2 != (PKCS8_PRIV_KEY_INFO *)0x0) {
      p8inf = (PKCS8_PRIV_KEY_INFO *)EVP_PKCS82PKEY(pPVar2);
      if (cb_local != (pem_password_cb *)0x0) {
        if (*(long *)cb_local != 0) {
          EVP_PKEY_free(*(EVP_PKEY **)cb_local);
        }
        *(PKCS8_PRIV_KEY_INFO **)cb_local = p8inf;
      }
      PKCS8_PRIV_KEY_INFO_free(pPVar2);
    }
  }
  else {
    iVar1 = strcmp((char *)p,"ENCRYPTED PRIVATE KEY");
    if (iVar1 == 0) {
      p8_00 = d2i_X509_SIG((X509_SIG **)0x0,&data,(long)ret);
      if (p8_00 != (X509_SIG *)0x0) {
        psbuf[0x3fc] = '\0';
        psbuf[0x3fd] = '\0';
        psbuf[0x3fe] = '\0';
        psbuf[0x3ff] = '\0';
        if (u_local == (void *)0x0) {
          u_local = PEM_def_callback;
        }
        psbuf._1020_4_ = (*(code *)u_local)(local_478,0x400,0,nm);
        if ((int)psbuf._1020_4_ < 0) {
          ERR_put_error(9,0,0x68,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pkey.cc"
                        ,0x48);
          X509_SIG_free(p8_00);
          goto LAB_0022f2e7;
        }
        pPVar2 = PKCS8_decrypt(p8_00,local_478,psbuf._1020_4_);
        X509_SIG_free(p8_00);
        OPENSSL_cleanse(local_478,(long)(int)psbuf._1020_4_);
        if (pPVar2 != (PKCS8_PRIV_KEY_INFO *)0x0) {
          p8inf = (PKCS8_PRIV_KEY_INFO *)EVP_PKCS82PKEY(pPVar2);
          if (cb_local != (pem_password_cb *)0x0) {
            if (*(long *)cb_local != 0) {
              EVP_PKEY_free(*(EVP_PKEY **)cb_local);
            }
            *(PKCS8_PRIV_KEY_INFO **)cb_local = p8inf;
          }
          PKCS8_PRIV_KEY_INFO_free(pPVar2);
        }
      }
    }
    else {
      iVar1 = strcmp((char *)p,"RSA PRIVATE KEY");
      if (iVar1 == 0) {
        p8inf = (PKCS8_PRIV_KEY_INFO *)d2i_PrivateKey(6,(EVP_PKEY **)cb_local,&data,(long)ret);
      }
      else {
        iVar1 = strcmp((char *)p,"EC PRIVATE KEY");
        if (iVar1 == 0) {
          p8inf = (PKCS8_PRIV_KEY_INFO *)d2i_PrivateKey(0x198,(EVP_PKEY **)cb_local,&data,(long)ret)
          ;
        }
        else {
          iVar1 = strcmp((char *)p,"DSA PRIVATE KEY");
          if (iVar1 == 0) {
            p8inf = (PKCS8_PRIV_KEY_INFO *)
                    d2i_PrivateKey(0x74,(EVP_PKEY **)cb_local,&data,(long)ret);
          }
        }
      }
    }
  }
  if (p8inf == (PKCS8_PRIV_KEY_INFO *)0x0) {
    ERR_put_error(9,0,0xc,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pkey.cc"
                  ,0x66);
  }
LAB_0022f2e7:
  OPENSSL_free(p);
  OPENSSL_free((void *)len);
  return (EVP_PKEY *)p8inf;
}

Assistant:

EVP_PKEY *PEM_read_bio_PrivateKey(BIO *bp, EVP_PKEY **x, pem_password_cb *cb,
                                  void *u) {
  char *nm = NULL;
  const unsigned char *p = NULL;
  unsigned char *data = NULL;
  long len;
  EVP_PKEY *ret = NULL;

  if (!PEM_bytes_read_bio(&data, &len, &nm, PEM_STRING_EVP_PKEY, bp, cb, u)) {
    return NULL;
  }
  p = data;

  if (strcmp(nm, PEM_STRING_PKCS8INF) == 0) {
    PKCS8_PRIV_KEY_INFO *p8inf;
    p8inf = d2i_PKCS8_PRIV_KEY_INFO(NULL, &p, len);
    if (!p8inf) {
      goto p8err;
    }
    ret = EVP_PKCS82PKEY(p8inf);
    if (x) {
      if (*x) {
        EVP_PKEY_free((EVP_PKEY *)*x);
      }
      *x = ret;
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
  } else if (strcmp(nm, PEM_STRING_PKCS8) == 0) {
    PKCS8_PRIV_KEY_INFO *p8inf;
    X509_SIG *p8;
    int pass_len;
    char psbuf[PEM_BUFSIZE];
    p8 = d2i_X509_SIG(NULL, &p, len);
    if (!p8) {
      goto p8err;
    }

    pass_len = 0;
    if (!cb) {
      cb = PEM_def_callback;
    }
    pass_len = cb(psbuf, PEM_BUFSIZE, 0, u);
    if (pass_len < 0) {
      OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_PASSWORD_READ);
      X509_SIG_free(p8);
      goto err;
    }
    p8inf = PKCS8_decrypt(p8, psbuf, pass_len);
    X509_SIG_free(p8);
    OPENSSL_cleanse(psbuf, pass_len);
    if (!p8inf) {
      goto p8err;
    }
    ret = EVP_PKCS82PKEY(p8inf);
    if (x) {
      if (*x) {
        EVP_PKEY_free((EVP_PKEY *)*x);
      }
      *x = ret;
    }
    PKCS8_PRIV_KEY_INFO_free(p8inf);
  } else if (strcmp(nm, PEM_STRING_RSA) == 0) {
    // TODO(davidben): d2i_PrivateKey parses PKCS#8 along with the
    // standalone format. This and the cases below probably should not
    // accept PKCS#8.
    ret = d2i_PrivateKey(EVP_PKEY_RSA, x, &p, len);
  } else if (strcmp(nm, PEM_STRING_EC) == 0) {
    ret = d2i_PrivateKey(EVP_PKEY_EC, x, &p, len);
  } else if (strcmp(nm, PEM_STRING_DSA) == 0) {
    ret = d2i_PrivateKey(EVP_PKEY_DSA, x, &p, len);
  }
p8err:
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_ASN1_LIB);
  }

err:
  OPENSSL_free(nm);
  OPENSSL_free(data);
  return ret;
}